

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLText::ShallowClone(XMLText *this,XMLDocument *doc)

{
  bool isCData;
  char *str;
  XMLText *this_00;
  XMLText *text;
  XMLDocument *doc_local;
  XMLText *this_local;
  
  text = (XMLText *)doc;
  if (doc == (XMLDocument *)0x0) {
    text = (XMLText *)(this->super_XMLNode)._document;
  }
  str = XMLNode::Value(&this->super_XMLNode);
  this_00 = XMLDocument::NewText((XMLDocument *)text,str);
  isCData = CData(this);
  SetCData(this_00,isCData);
  return &this_00->super_XMLNode;
}

Assistant:

XMLNode* XMLText::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLText* text = doc->NewText( Value() );	// fixme: this will always allocate memory. Intern?
    text->SetCData( this->CData() );
    return text;
}